

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex.h
# Opt level: O1

data_node_type * __thiscall
alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::
bulk_load_leaf_node_from_existing
          (Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
           *this,data_node_type *existing_node,int left,int right,bool compute_cost,
          FTNode *tree_node,bool reuse_model,bool keep_left,bool keep_right)

{
  int *piVar1;
  AlexDataNode<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
  *this_00;
  int iVar2;
  double dVar3;
  LinearModel<double> *precomputed_model;
  LinearModel<double> local_48;
  
  this_00 = (AlexDataNode<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
             *)operator_new(0xd0);
  (this_00->super_AlexNode<double,_double>).is_leaf_ = true;
  (this_00->super_AlexNode<double,_double>).duplication_factor_ = '\0';
  (this_00->super_AlexNode<double,_double>).level_ = 0;
  (this_00->super_AlexNode<double,_double>).model_.a_ = 0.0;
  (this_00->super_AlexNode<double,_double>).model_.b_ = 0.0;
  (this_00->super_AlexNode<double,_double>).cost_ = 0.0;
  (this_00->super_AlexNode<double,_double>)._vptr_AlexNode =
       (_func_int **)&PTR__AlexDataNode_0011ac50;
  this_00->key_less_ = (AlexCompare *)&this->field_0xc8;
  this_00->allocator_ = (allocator<std::pair<double,_double>_> *)&this->field_0xc9;
  this_00->next_leaf_ = (self_type *)0x0;
  this_00->prev_leaf_ = (self_type *)0x0;
  this_00->key_slots_ = (double *)0x0;
  this_00->payload_slots_ = (double *)0x0;
  *(undefined8 *)((long)&this_00->key_slots_ + 4) = 0;
  *(undefined8 *)((long)&this_00->payload_slots_ + 4) = 0;
  *(undefined8 *)&this_00->num_keys_ = 0;
  *(undefined8 *)((long)&this_00->bitmap_ + 4) = 0;
  this_00->expansion_threshold_ = 1.0;
  this_00->contraction_threshold_ = 0.0;
  this_00->max_slots_ = 0x100000;
  this_00->num_shifts_ = 0;
  this_00->num_exp_search_iterations_ = 0;
  *(undefined8 *)((long)&this_00->num_exp_search_iterations_ + 4) = 0;
  this_00->num_inserts_ = 0;
  this_00->num_resizes_ = 0;
  this_00->max_key_ = -1.79769313486232e+308;
  this_00->min_key_ = 1.79769313486232e+308;
  this_00->expected_avg_shifts_ = 0.0;
  this_00->num_right_out_of_bounds_inserts_ = 0;
  this_00->num_left_out_of_bounds_inserts_ = 0;
  this_00->expected_avg_exp_search_iterations_ = 0.0;
  piVar1 = &(this->stats_).num_data_nodes;
  *piVar1 = *piVar1 + 1;
  if (tree_node == (FTNode *)0x0) {
    if (reuse_model) {
      iVar2 = AlexDataNode<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
              ::num_keys_in_range(existing_node,left,right);
      precomputed_model = &local_48;
      local_48.b_ = (double)iVar2 / (double)(right - left);
      local_48.a_ = (existing_node->super_AlexNode<double,_double>).model_.a_ * local_48.b_;
      local_48.b_ = local_48.b_ *
                    ((existing_node->super_AlexNode<double,_double>).model_.b_ - (double)left);
    }
    else {
      iVar2 = -1;
      precomputed_model = (LinearModel<double> *)0x0;
    }
  }
  else {
    local_48.a_ = tree_node->a;
    local_48.b_ = tree_node->b;
    precomputed_model = &local_48;
    iVar2 = tree_node->num_keys;
  }
  AlexDataNode<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
  ::bulk_load_from_existing
            (this_00,existing_node,left,right,keep_left,keep_right,precomputed_model,iVar2);
  this_00->max_slots_ = (this->derived_params_).max_data_node_slots;
  if (compute_cost) {
    iVar2 = existing_node->num_lookups_ + existing_node->num_inserts_;
    dVar3 = AlexDataNode<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
            ::compute_expected_cost
                      (this_00,(double)((ulong)(iVar2 != 0) *
                                       (long)((double)existing_node->num_inserts_ / (double)iVar2)))
    ;
    (this_00->super_AlexNode<double,_double>).cost_ = dVar3;
  }
  return this_00;
}

Assistant:

data_node_type* bulk_load_leaf_node_from_existing(
      const data_node_type* existing_node, int left, int right,
      bool compute_cost = true, const fanout_tree::FTNode* tree_node = nullptr,
      bool reuse_model = false, bool keep_left = false,
      bool keep_right = false) {
    auto node = new (data_node_allocator().allocate(1))
        data_node_type(key_less_, allocator_);
    stats_.num_data_nodes++;
    if (tree_node) {
      // Use the model and num_keys saved in the tree node so we don't have to
      // recompute it
      LinearModel<T> precomputed_model(tree_node->a, tree_node->b);
      node->bulk_load_from_existing(existing_node, left, right, keep_left,
                                    keep_right, &precomputed_model,
                                    tree_node->num_keys);
    } else if (reuse_model) {
      // Use the model from the existing node
      // Assumes the model is accurate
      int num_actual_keys = existing_node->num_keys_in_range(left, right);
      LinearModel<T> precomputed_model(existing_node->model_);
      precomputed_model.b_ -= left;
      precomputed_model.expand(static_cast<double>(num_actual_keys) /
                               (right - left));
      node->bulk_load_from_existing(existing_node, left, right, keep_left,
                                    keep_right, &precomputed_model,
                                    num_actual_keys);
    } else {
      node->bulk_load_from_existing(existing_node, left, right, keep_left,
                                    keep_right);
    }
    node->max_slots_ = derived_params_.max_data_node_slots;
    if (compute_cost) {
      node->cost_ = node->compute_expected_cost(existing_node->frac_inserts());
    }
    return node;
  }